

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ClassDeclarationSyntax *pCVar1;
  ParameterPortListSyntax **unaff_R14;
  ExtendsClauseSyntax **unaff_R15;
  Token TVar2;
  ImplementsClauseSyntax **unaff_retaddr;
  Token *in_stack_00000008;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_00000010;
  Token *in_stack_00000018;
  NamedBlockClauseSyntax **in_stack_00000020;
  BumpAllocator *in_stack_00000028;
  Token *in_stack_00000030;
  BumpAllocator *in_stack_fffffffffffffed8;
  ParameterPortListSyntax *in_stack_fffffffffffffee0;
  ExtendsClauseSyntax *local_d0;
  ParameterPortListSyntax *local_c8;
  ClassSpecifierSyntax *local_c0;
  BumpAllocator *in_stack_ffffffffffffff88;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffff90;
  BumpAllocator *this;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  parsing::Token::deepClone(in_stack_00000030,in_stack_00000028);
  TVar2 = parsing::Token::deepClone(in_stack_00000030,in_stack_00000028);
  this = TVar2._0_8_;
  if (*(long *)(__fn + 0x70) == 0) {
    local_c0 = (ClassSpecifierSyntax *)0x0;
  }
  else {
    local_c0 = deepClone<slang::syntax::ClassSpecifierSyntax>
                         ((ClassSpecifierSyntax *)in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffed8);
  }
  TVar2 = parsing::Token::deepClone(in_stack_00000030,in_stack_00000028);
  if (*(long *)(__fn + 0x88) == 0) {
    local_c8 = (ParameterPortListSyntax *)0x0;
  }
  else {
    local_c8 = deepClone<slang::syntax::ParameterPortListSyntax>
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  if (*(long *)(__fn + 0x90) == 0) {
    local_d0 = (ExtendsClauseSyntax *)0x0;
  }
  else {
    local_d0 = deepClone<slang::syntax::ExtendsClauseSyntax>
                         ((ExtendsClauseSyntax *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8
                         );
  }
  if (*(long *)(__fn + 0x98) != 0) {
    deepClone<slang::syntax::ImplementsClauseSyntax>
              ((ImplementsClauseSyntax *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  parsing::Token::deepClone(in_stack_00000030,in_stack_00000028);
  deepClone<slang::syntax::MemberSyntax>
            ((SyntaxList<slang::syntax::MemberSyntax> *)local_c8,(BumpAllocator *)local_d0);
  parsing::Token::deepClone(in_stack_00000030,in_stack_00000028);
  if (*(long *)(__fn + 0xf8) != 0) {
    deepClone<slang::syntax::NamedBlockClauseSyntax>
              ((NamedBlockClauseSyntax *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ClassDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ClassSpecifierSyntax*,slang::parsing::Token,slang::syntax::ParameterPortListSyntax*,slang::syntax::ExtendsClauseSyntax*,slang::syntax::ImplementsClauseSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     (this,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c0,
                      (Token *)TVar2.info,TVar2._0_8_,(ClassSpecifierSyntax **)local_c8,
                      (Token *)local_d0,unaff_R14,unaff_R15,unaff_retaddr,in_stack_00000008,
                      in_stack_00000010,in_stack_00000018,in_stack_00000020);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ClassDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ClassDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.virtualOrInterface.deepClone(alloc),
        node.classKeyword.deepClone(alloc),
        node.finalSpecifier ? deepClone(*node.finalSpecifier, alloc) : nullptr,
        node.name.deepClone(alloc),
        node.parameters ? deepClone(*node.parameters, alloc) : nullptr,
        node.extendsClause ? deepClone(*node.extendsClause, alloc) : nullptr,
        node.implementsClause ? deepClone(*node.implementsClause, alloc) : nullptr,
        node.semi.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.endClass.deepClone(alloc),
        node.endBlockName ? deepClone(*node.endBlockName, alloc) : nullptr
    );
}